

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPermit::IfcPermit(IfcPermit *this)

{
  IfcPermit *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x110,"IfcPermit");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00f7c2e0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>,
             &PTR_construction_vtable_24__00f7c390);
  *(undefined8 *)this = 0xf7c200;
  *(undefined8 *)&this->field_0x110 = 0xf7c2c8;
  *(undefined8 *)&this->field_0x88 = 0xf7c228;
  *(undefined8 *)&this->field_0x98 = 0xf7c250;
  *(undefined8 *)&this->field_0xd0 = 0xf7c278;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf7c2a0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x10);
  return;
}

Assistant:

IfcPermit() : Object("IfcPermit") {}